

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_date(lua_State *L)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  time_t tVar4;
  ulong uVar5;
  size_t sVar6;
  long in_RDI;
  lua_Number lVar7;
  size_t len;
  char *buf;
  char *q;
  MSize retry;
  MSize sz;
  SBuf *sb;
  tm rtm;
  tm *stm;
  time_t t;
  char *s;
  undefined4 in_stack_fffffffffffffe78;
  MSize in_stack_fffffffffffffe7c;
  lua_State *in_stack_fffffffffffffe80;
  lua_State *in_stack_fffffffffffffe88;
  lua_State *L_00;
  lua_State *in_stack_fffffffffffffe90;
  lua_State *in_stack_fffffffffffffe98;
  lua_State *in_stack_fffffffffffffea0;
  char *local_158;
  int local_150;
  uint local_14c;
  size_t in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  lua_State *in_stack_fffffffffffffef0;
  tm *local_108;
  time_t local_100;
  char *local_f8;
  long local_f0;
  uint local_e4;
  long local_e0;
  char *local_d8;
  GCstr *local_b8;
  lua_State *local_b0;
  undefined4 local_9c;
  GCstr *local_98;
  lua_State *local_90;
  undefined4 local_44;
  GCstr *local_40;
  lua_State *local_38;
  char *local_18;
  lua_State *local_10;
  
  local_f0 = in_RDI;
  local_f8 = luaL_optlstring(in_stack_fffffffffffffea0,
                             (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                             (char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88);
  iVar3 = lua_type(in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  if (iVar3 < 1) {
    tVar4 = time((time_t *)0x0);
  }
  else {
    lVar7 = luaL_checknumber(in_stack_fffffffffffffe90,
                             (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    tVar4 = (time_t)lVar7;
  }
  local_100 = tVar4;
  if (*local_f8 == '!') {
    local_f8 = local_f8 + 1;
    local_108 = gmtime_r(&local_100,(tm *)&stack0xfffffffffffffec0);
  }
  else {
    local_108 = localtime_r(&local_100,(tm *)&stack0xfffffffffffffec0);
  }
  if (local_108 == (tm *)0x0) {
    lVar1 = *(long *)(local_f0 + 0x18);
    *(long *)(local_f0 + 0x18) = lVar1 + 8;
    *(undefined4 *)(lVar1 + 4) = 0xffffffff;
  }
  else {
    iVar3 = strcmp(local_f8,"*t");
    if (iVar3 == 0) {
      lua_createtable(in_stack_fffffffffffffe98,(int)((ulong)tVar4 >> 0x20),(int)tVar4);
      setfield(in_stack_fffffffffffffe80,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
      setfield(in_stack_fffffffffffffe80,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
      setfield(in_stack_fffffffffffffe80,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
      setfield(in_stack_fffffffffffffe80,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
      setfield(in_stack_fffffffffffffe80,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
      setfield(in_stack_fffffffffffffe80,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
      setfield(in_stack_fffffffffffffe80,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
      setfield(in_stack_fffffffffffffe80,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
      setboolfield(in_stack_fffffffffffffe80,
                   (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
    }
    else if (*local_f8 == '\0') {
      piVar2 = *(int **)(local_f0 + 0x18);
      *(int **)(local_f0 + 0x18) = piVar2 + 2;
      *piVar2 = *(int *)(local_f0 + 8) + 0xf8;
      piVar2[1] = -5;
    }
    else {
      uVar5 = (ulong)*(uint *)(local_f0 + 8);
      local_14c = 0;
      local_150 = 4;
      for (local_158 = local_f8; *local_158 != '\0'; local_158 = local_158 + 1) {
        iVar3 = 1;
        if (*local_158 == '%') {
          iVar3 = 0x1e;
        }
        local_14c = iVar3 + local_14c;
      }
      *(int *)(uVar5 + 0xf4) = (int)local_f0;
      while (local_150 != 0) {
        local_e4 = local_14c;
        local_e0 = uVar5 + 0xe8;
        if ((uint)(*(int *)(uVar5 + 0xec) - *(int *)(uVar5 + 0xf0)) < local_14c) {
          local_d8 = lj_buf_need2((SBuf *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
        }
        else {
          local_d8 = (char *)(ulong)*(uint *)(uVar5 + 0xf0);
        }
        sVar6 = strftime(local_d8,(ulong)(uint)(*(int *)(uVar5 + 0xec) - *(int *)(uVar5 + 0xf0)),
                         local_f8,local_108);
        if (sVar6 != 0) {
          L_00 = *(lua_State **)(local_f0 + 0x18);
          *(MRef **)(local_f0 + 0x18) = &L_00->glref;
          local_b8 = lj_str_new(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                                in_stack_fffffffffffffee0);
          local_9c = 0xfffffffb;
          local_44 = 0xfffffffb;
          (L_00->nextgc).gcptr32 = (uint32_t)local_b8;
          L_00->marked = 0xfb;
          L_00->gct = 0xff;
          L_00->dummy_ffid = 0xff;
          L_00->status = 0xff;
          local_18 = "store to dead GC object";
          if (*(uint *)((ulong)*(uint *)(local_f0 + 8) + 0x50) <
              *(uint *)((ulong)*(uint *)(local_f0 + 8) + 0x54)) {
            return 1;
          }
          local_b0 = L_00;
          local_98 = local_b8;
          local_90 = L_00;
          local_40 = local_b8;
          local_38 = L_00;
          local_10 = L_00;
          lj_gc_step(L_00);
          return 1;
        }
        local_14c = (local_14c | 1) + local_14c;
        local_150 = local_150 + -1;
      }
    }
  }
  return 1;
}

Assistant:

LJLIB_CF(os_date)
{
  const char *s = luaL_optstring(L, 1, "%c");
  time_t t = luaL_opt(L, (time_t)luaL_checknumber, 2, time(NULL));
  struct tm *stm;
#if LJ_TARGET_POSIX
  struct tm rtm;
#endif
  if (*s == '!') {  /* UTC? */
    s++;  /* Skip '!' */
#if LJ_TARGET_POSIX
    stm = gmtime_r(&t, &rtm);
#else
    stm = gmtime(&t);
#endif
  } else {
#if LJ_TARGET_POSIX
    stm = localtime_r(&t, &rtm);
#else
    stm = localtime(&t);
#endif
  }
  if (stm == NULL) {  /* Invalid date? */
    setnilV(L->top++);
  } else if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setfield(L, "sec", stm->tm_sec);
    setfield(L, "min", stm->tm_min);
    setfield(L, "hour", stm->tm_hour);
    setfield(L, "day", stm->tm_mday);
    setfield(L, "month", stm->tm_mon+1);
    setfield(L, "year", stm->tm_year+1900);
    setfield(L, "wday", stm->tm_wday+1);
    setfield(L, "yday", stm->tm_yday+1);
    setboolfield(L, "isdst", stm->tm_isdst);
  } else if (*s) {
    SBuf *sb = &G(L)->tmpbuf;
    MSize sz = 0, retry = 4;
    const char *q;
    for (q = s; *q; q++)
      sz += (*q == '%') ? 30 : 1;  /* Overflow doesn't matter. */
    setsbufL(sb, L);
    while (retry--) {  /* Limit growth for invalid format or empty result. */
      char *buf = lj_buf_need(sb, sz);
      size_t len = strftime(buf, sbufsz(sb), s, stm);
      if (len) {
	setstrV(L, L->top++, lj_str_new(L, buf, len));
	lj_gc_check(L);
	break;
      }
      sz += (sz|1);
    }
  } else {
    setstrV(L, L->top++, &G(L)->strempty);
  }
  return 1;
}